

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.cpp
# Opt level: O3

bool wallet::operator<(BytePrefix a,Span<const_std::byte> b)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  ulong __n;
  long __d2;
  ulong uVar4;
  ulong uVar5;
  long __d1;
  long in_FS_OFFSET;
  
  uVar5 = a.prefix.m_size;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar4 = b.m_size;
  if (uVar5 <= b.m_size) {
    uVar4 = uVar5;
  }
  __n = uVar5;
  if ((long)uVar4 < (long)uVar5) {
    __n = uVar4;
  }
  if (__n == 0) {
    bVar2 = (long)uVar5 < (long)uVar4;
  }
  else {
    iVar3 = memcmp(a.prefix.m_data,b.m_data,__n);
    bVar2 = true;
    if (-1 < iVar3) {
      bVar2 = (long)uVar5 < (long)uVar4 && iVar3 == 0;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool operator<(BytePrefix a, Span<const std::byte> b) { return std::ranges::lexicographical_compare(a.prefix, b.subspan(0, std::min(a.prefix.size(), b.size()))); }